

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

int N_VConstVectorArray_Serial(int nvec,realtype c,N_Vector *Z)

{
  uint uVar1;
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long lVar8;
  
  auVar2 = _DAT_0065b9b0;
  auVar7 = _DAT_0065b9a0;
  if (nvec < 1) {
    return -1;
  }
  uVar1 = *(*Z)->content;
  if (nvec == 1) {
    if (0 < (int)uVar1) {
      lVar4 = *(long *)((long)(*Z)->content + 8);
      lVar3 = (ulong)uVar1 - 1;
      auVar6._8_4_ = (int)lVar3;
      auVar6._0_8_ = lVar3;
      auVar6._12_4_ = (int)((ulong)lVar3 >> 0x20);
      lVar3 = 0;
      auVar6 = auVar6 ^ _DAT_0065b9b0;
      do {
        auVar9 = auVar7 ^ auVar2;
        if ((bool)(~(auVar9._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar9._0_4_ ||
                    auVar6._4_4_ < auVar9._4_4_) & 1)) {
          *(realtype *)(lVar4 + lVar3) = c;
        }
        if ((auVar9._12_4_ != auVar6._12_4_ || auVar9._8_4_ <= auVar6._8_4_) &&
            auVar9._12_4_ <= auVar6._12_4_) {
          *(realtype *)(lVar4 + 8 + lVar3) = c;
        }
        lVar8 = auVar7._8_8_;
        auVar7._0_8_ = auVar7._0_8_ + 2;
        auVar7._8_8_ = lVar8 + 2;
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(uVar1 + 1 >> 1) << 4 != lVar3);
    }
  }
  else {
    lVar4 = (ulong)uVar1 - 1;
    auVar9._8_4_ = (int)lVar4;
    auVar9._0_8_ = lVar4;
    auVar9._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar5 = 0;
    auVar9 = auVar9 ^ _DAT_0065b9b0;
    do {
      if (0 < (int)uVar1) {
        lVar4 = *(long *)((long)Z[uVar5]->content + 8);
        lVar3 = 0;
        auVar10 = auVar7;
        do {
          auVar6 = auVar10 ^ auVar2;
          if ((bool)(~(auVar9._4_4_ < auVar6._4_4_ ||
                      auVar9._0_4_ < auVar6._0_4_ && auVar6._4_4_ == auVar9._4_4_) & 1)) {
            *(realtype *)(lVar4 + lVar3) = c;
          }
          if (auVar6._12_4_ <= auVar9._12_4_ &&
              (auVar6._8_4_ <= auVar9._8_4_ || auVar6._12_4_ != auVar9._12_4_)) {
            *(realtype *)(lVar4 + 8 + lVar3) = c;
          }
          lVar8 = auVar10._8_8_;
          auVar10._0_8_ = auVar10._0_8_ + 2;
          auVar10._8_8_ = lVar8 + 2;
          lVar3 = lVar3 + 0x10;
        } while ((ulong)(uVar1 + 1 >> 1) << 4 != lVar3);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)nvec);
  }
  return 0;
}

Assistant:

int N_VConstVectorArray_Serial(int nvec, realtype c, N_Vector* Z)
{
  int          i;
  sunindextype j, N;
  realtype*    zd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VConst */
  if (nvec == 1) {
    N_VConst_Serial(c, Z[0]);
    return(0);
  }

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /* set each vector in the vector array to a constant */
  for (i=0; i<nvec; i++) {
    zd = NV_DATA_S(Z[i]);
    for (j=0; j<N; j++) {
      zd[j] = c;
    }
  }

  return(0);
}